

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O0

Reals __thiscall
Omega_h::get_curv_vert_curvatures
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_curvatures,
          LOs *curv_vert2vert)

{
  LOs *pLVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Reals RVar4;
  Read<int> local_a0;
  Read<double> local_90;
  Read<int> local_80;
  Read<int> local_70 [2];
  Read<double> local_50;
  Read<int> local_40;
  LOs *local_30;
  LOs *curv_vert2vert_local;
  Reals *curv_edge_curvatures_local;
  LOs *curv_edge2edge_local;
  Mesh *mesh_local;
  
  local_30 = curv_vert2vert;
  curv_vert2vert_local = (LOs *)curv_edge_curvatures;
  curv_edge_curvatures_local = (Reals *)curv_edge2edge;
  curv_edge2edge_local = (LOs *)mesh;
  mesh_local = (Mesh *)this;
  IVar2 = Mesh::dim(mesh);
  pLVar1 = curv_edge2edge_local;
  if (IVar2 == 3) {
    Read<int>::Read(&local_40,curv_edge2edge);
    Read<double>::Read(&local_50,curv_edge_curvatures);
    Read<int>::Read(local_70,curv_vert2vert);
    get_curv_vert_curvatures_dim<3>(this,(Mesh *)pLVar1,&local_40,&local_50,local_70);
    Read<int>::~Read(local_70);
    Read<double>::~Read(&local_50);
    Read<int>::~Read(&local_40);
    pvVar3 = extraout_RDX;
  }
  else {
    IVar2 = Mesh::dim((Mesh *)curv_edge2edge_local);
    pLVar1 = curv_edge2edge_local;
    if (IVar2 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x243);
    }
    Read<int>::Read(&local_80,curv_edge2edge);
    Read<double>::Read(&local_90,curv_edge_curvatures);
    Read<int>::Read(&local_a0,curv_vert2vert);
    get_curv_vert_curvatures_dim<2>(this,(Mesh *)pLVar1,&local_80,&local_90,&local_a0);
    Read<int>::~Read(&local_a0);
    Read<double>::~Read(&local_90);
    Read<int>::~Read(&local_80);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_curvatures(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_curvatures, LOs curv_vert2vert) {
  if (mesh->dim() == 3) {
    return get_curv_vert_curvatures_dim<3>(
        mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  }
  if (mesh->dim() == 2) {
    return get_curv_vert_curvatures_dim<2>(
        mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  }
  OMEGA_H_NORETURN(Reals());
}